

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

BinaryExpr<const_type_safe::tagged_union<int,_double,_debugger_type>::type_id_&,_const_type_safe::tagged_union<int,_double,_debugger_type>::type_id_&>
* __thiscall
Catch::ExprLhs<type_safe::tagged_union<int,double,debugger_type>::type_id_const&>::operator==
          (BinaryExpr<const_type_safe::tagged_union<int,_double,_debugger_type>::type_id_&,_const_type_safe::tagged_union<int,_double,_debugger_type>::type_id_&>
           *__return_storage_ptr__,
          ExprLhs<type_safe::tagged_union<int,double,debugger_type>::type_id_const&> *this,
          type_id *rhs)

{
  type_id *ptVar1;
  unsigned_long uVar2;
  unsigned_long uVar3;
  StringRef local_40;
  
  ptVar1 = *(type_id **)this;
  uVar2 = (ptVar1->
          super_strong_typedef<type_safe::tagged_union<int,_double,_debugger_type>::type_id,_unsigned_long>
          ).value_;
  uVar3 = (rhs->
          super_strong_typedef<type_safe::tagged_union<int,_double,_debugger_type>::type_id,_unsigned_long>
          ).value_;
  StringRef::StringRef(&local_40,"==");
  (__return_storage_ptr__->super_ITransientExpression).m_isBinaryExpression = true;
  (__return_storage_ptr__->super_ITransientExpression).m_result = uVar2 == uVar3;
  (__return_storage_ptr__->super_ITransientExpression)._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_0021e950;
  __return_storage_ptr__->m_lhs = ptVar1;
  (__return_storage_ptr__->m_op).m_start = local_40.m_start;
  (__return_storage_ptr__->m_op).m_size = local_40.m_size;
  __return_storage_ptr__->m_rhs = rhs;
  return __return_storage_ptr__;
}

Assistant:

auto operator == ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { compareEqual( m_lhs, rhs ), m_lhs, "==", rhs };
        }